

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

bool cmHasSuffix(string_view str,cmValue suffix)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  long lVar5;
  size_type __n1;
  string *this;
  bool local_39;
  cmValue local_28;
  cmValue suffix_local;
  string_view str_local;
  
  suffix_local.Value = (string *)str._M_len;
  local_28.Value = suffix.Value;
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar1) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&suffix_local);
    cmValue::operator->[abi_cxx11_(&local_28);
    uVar4 = std::__cxx11::string::size();
    local_39 = false;
    if (uVar4 <= sVar3) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&suffix_local);
      cmValue::operator->[abi_cxx11_(&local_28);
      lVar5 = std::__cxx11::string::size();
      cmValue::operator->[abi_cxx11_(&local_28);
      __n1 = std::__cxx11::string::size();
      this = cmValue::operator*[abi_cxx11_(&local_28);
      __str = (basic_string_view<char,_std::char_traits<char>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&suffix_local,
                         sVar3 - lVar5,__n1,__str);
      local_39 = iVar2 == 0;
    }
    str_local._M_str._7_1_ = local_39;
  }
  else {
    str_local._M_str._7_1_ = false;
  }
  return str_local._M_str._7_1_;
}

Assistant:

inline bool cmHasSuffix(cm::string_view str, cmValue suffix)
{
  if (!suffix) {
    return false;
  }

  return str.size() >= suffix->size() &&
    str.compare(str.size() - suffix->size(), suffix->size(), *suffix) == 0;
}